

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O2

path * __thiscall filesystem::path::operator/(path *__return_storage_ptr__,path *this,path *other)

{
  pointer pbVar1;
  runtime_error *this_00;
  long lVar2;
  size_t i;
  ulong uVar3;
  
  if (other->m_absolute == true) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"path::operator/(): expected a relative path!");
  }
  else {
    if (this->m_type == other->m_type) {
      path(__return_storage_ptr__,this);
      lVar2 = 0;
      for (uVar3 = 0;
          pbVar1 = (other->m_path).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start,
          uVar3 < (ulong)((long)(other->m_path).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
          uVar3 = uVar3 + 1) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&__return_storage_ptr__->m_path,
                    (value_type *)((long)&(pbVar1->_M_dataplus)._M_p + lVar2));
        lVar2 = lVar2 + 0x20;
      }
      return __return_storage_ptr__;
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_00,"path::operator/(): expected a path of the same type!");
  }
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

path operator/(const path &other) const {
        if (other.m_absolute)
            throw std::runtime_error("path::operator/(): expected a relative path!");
        if (m_type != other.m_type)
            throw std::runtime_error("path::operator/(): expected a path of the same type!");

        path result(*this);

        for (size_t i=0; i<other.m_path.size(); ++i)
            result.m_path.push_back(other.m_path[i]);

        return result;
    }